

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::
priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
::priority_queue(priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:33:11)>
                 *this,anon_class_1_0_00000001_for_mLess *c)

{
  undefined8 *puVar1;
  Song *local_30;
  anon_class_1_0_00000001_for_mLess *c_local;
  priority_queue<Song,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_noppakorn[P]2110211_grader_d58_q2_custom_song_h:33:11)>
  *this_local;
  
  puVar1 = (undefined8 *)operator_new__(0x50);
  *puVar1 = 1;
  local_30 = (Song *)(puVar1 + 1);
  do {
    Song::Song(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (Song *)(puVar1 + 10));
  this->mData = (Song *)(puVar1 + 1);
  this->mCap = 1;
  this->mSize = 0;
  return;
}

Assistant:

priority_queue(const Comp& c = Comp() ) :
       mData( new T[1]() ),
       mCap( 1 ),
       mSize( 0 ),
       mLess( c )
    { }